

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O0

bool SanityCheckASMap(vector<bool,_std::allocator<bool>_> *asmap,int bits)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  const_reference cVar4;
  Instruction IVar5;
  uint32_t uVar6;
  uint uVar7;
  _If_is_unsigned_integer<unsigned_int> _Var8;
  int iVar9;
  ptrdiff_t pVar10;
  reference pvVar11;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *this;
  uint *__args;
  int in_ESI;
  long in_FS_OFFSET;
  uint32_t asn_1;
  int matchlen;
  uint32_t match;
  uint32_t jump;
  uint32_t asn;
  Instruction opcode;
  uint32_t offset;
  bool had_incomplete_match;
  Instruction prevopcode;
  uint32_t jump_offset;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> jumps;
  const_iterator pos;
  const_iterator endpos;
  const_iterator begin;
  undefined4 in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffed4;
  uint32_t in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  size_type in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  int local_98;
  bool local_7d;
  int local_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<bool,_std::allocator<bool>_>::begin
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::vector<bool,_std::allocator<bool>_>::end
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::vector
            ((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::reserve
            ((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )CONCAT17(in_stack_ffffffffffffff0f,
                       CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)),
             in_stack_ffffffffffffff00);
  local_98 = 1;
  bVar3 = false;
  local_3c = in_ESI;
  while (bVar2 = std::operator==((_Bit_iterator_base *)
                                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                 (_Bit_iterator_base *)
                                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    pVar10 = std::operator-((_Bit_iterator_base *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                            (_Bit_iterator_base *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    bVar2 = std::
            vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
            empty((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                   *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if ((!bVar2) &&
       (pvVar11 = std::
                  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                  ::back((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)),
       pvVar11->first <= (uint)pVar10)) {
      local_7d = false;
      goto LAB_01ab372a;
    }
    IVar5 = anon_unknown.dwarf_349e729::DecodeType
                      ((const_iterator *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (const_iterator *)
                       CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    if (IVar5 == RETURN) {
      if (local_98 == 3) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      uVar6 = anon_unknown.dwarf_349e729::DecodeASN
                        ((const_iterator *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                         (const_iterator *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      if (uVar6 == 0xffffffff) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      bVar2 = std::
              vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
              empty((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                     *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      if (bVar2) {
        pVar10 = std::operator-((_Bit_iterator_base *)
                                CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                (_Bit_iterator_base *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        if (pVar10 < 8) goto LAB_01ab32d5;
        local_7d = false;
        goto LAB_01ab372a;
      }
      pVar10 = std::operator-((_Bit_iterator_base *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                              (_Bit_iterator_base *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      pvVar11 = std::
                vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                ::back((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      if ((uint)pVar10 != pvVar11->first) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      pvVar11 = std::
                vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                ::back((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_3c = pvVar11->second;
      std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
      pop_back((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_98 = 1;
    }
    else if (IVar5 == JUMP) {
      uVar6 = anon_unknown.dwarf_349e729::DecodeJump
                        ((const_iterator *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                         (const_iterator *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      if (uVar6 == 0xffffffff) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      this = (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )(ulong)uVar6;
      pVar10 = std::operator-((_Bit_iterator_base *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                              (_Bit_iterator_base *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      if (pVar10 < (long)this) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      if (local_3c == 0) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      local_3c = local_3c + -1;
      __args = (uint *)std::operator-((_Bit_iterator_base *)
                                      CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                      (_Bit_iterator_base *)
                                      CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0))
      ;
      uVar7 = (int)__args + uVar6;
      bVar2 = std::
              vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
              empty((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                     *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      if ((!bVar2) &&
         (pvVar11 = std::
                    vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                    ::back((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                            *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)),
         in_stack_fffffffffffffedc = uVar7, pvVar11->first <= uVar7)) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
      emplace_back<unsigned_int&,int&>
                (this,__args,(int *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      local_98 = 1;
    }
    else if (IVar5 == MATCH) {
      in_stack_fffffffffffffed8 =
           anon_unknown.dwarf_349e729::DecodeMatch
                     ((const_iterator *)
                      CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                      (const_iterator *)
                      CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      if (in_stack_fffffffffffffed8 == 0xffffffff) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      _Var8 = std::bit_width<unsigned_int>(in_stack_fffffffffffffecc);
      iVar9 = _Var8 - 1;
      if (local_98 != 2) {
        bVar3 = false;
      }
      if ((iVar9 < 8) && (bVar3)) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      bVar3 = iVar9 < 8;
      if (local_3c < iVar9) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      local_3c = local_3c - iVar9;
      local_98 = 2;
    }
    else {
      if (IVar5 != DEFAULT) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      if (local_98 == 3) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      in_stack_fffffffffffffed4 =
           anon_unknown.dwarf_349e729::DecodeASN
                     ((const_iterator *)
                      CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                      (const_iterator *)
                      CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      if (in_stack_fffffffffffffed4 == 0xffffffff) {
        local_7d = false;
        goto LAB_01ab372a;
      }
      local_98 = 3;
    }
  }
  local_7d = false;
LAB_01ab372a:
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::~vector
            ((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_7d;
LAB_01ab32d5:
  bVar3 = std::operator==((_Bit_iterator_base *)
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (_Bit_iterator_base *)
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  if (((bVar3 ^ 0xffU) & 1) == 0) goto LAB_01ab3342;
  cVar4 = std::_Bit_const_iterator::operator*
                    ((_Bit_const_iterator *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (cVar4) {
    local_7d = false;
    goto LAB_01ab372a;
  }
  std::_Bit_const_iterator::operator++
            ((_Bit_const_iterator *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  goto LAB_01ab32d5;
LAB_01ab3342:
  local_7d = true;
  goto LAB_01ab372a;
}

Assistant:

bool SanityCheckASMap(const std::vector<bool>& asmap, int bits)
{
    const std::vector<bool>::const_iterator begin = asmap.begin(), endpos = asmap.end();
    std::vector<bool>::const_iterator pos = begin;
    std::vector<std::pair<uint32_t, int>> jumps; // All future positions we may jump to (bit offset in asmap -> bits to consume left)
    jumps.reserve(bits);
    Instruction prevopcode = Instruction::JUMP;
    bool had_incomplete_match = false;
    while (pos != endpos) {
        uint32_t offset = pos - begin;
        if (!jumps.empty() && offset >= jumps.back().first) return false; // There was a jump into the middle of the previous instruction
        Instruction opcode = DecodeType(pos, endpos);
        if (opcode == Instruction::RETURN) {
            if (prevopcode == Instruction::DEFAULT) return false; // There should not be any RETURN immediately after a DEFAULT (could be combined into just RETURN)
            uint32_t asn = DecodeASN(pos, endpos);
            if (asn == INVALID) return false; // ASN straddles EOF
            if (jumps.empty()) {
                // Nothing to execute anymore
                if (endpos - pos > 7) return false; // Excessive padding
                while (pos != endpos) {
                    if (*pos) return false; // Nonzero padding bit
                    ++pos;
                }
                return true; // Sanely reached EOF
            } else {
                // Continue by pretending we jumped to the next instruction
                offset = pos - begin;
                if (offset != jumps.back().first) return false; // Unreachable code
                bits = jumps.back().second; // Restore the number of bits we would have had left after this jump
                jumps.pop_back();
                prevopcode = Instruction::JUMP;
            }
        } else if (opcode == Instruction::JUMP) {
            uint32_t jump = DecodeJump(pos, endpos);
            if (jump == INVALID) return false; // Jump offset straddles EOF
            if (int64_t{jump} > int64_t{endpos - pos}) return false; // Jump out of range
            if (bits == 0) return false; // Consuming bits past the end of the input
            --bits;
            uint32_t jump_offset = pos - begin + jump;
            if (!jumps.empty() && jump_offset >= jumps.back().first) return false; // Intersecting jumps
            jumps.emplace_back(jump_offset, bits);
            prevopcode = Instruction::JUMP;
        } else if (opcode == Instruction::MATCH) {
            uint32_t match = DecodeMatch(pos, endpos);
            if (match == INVALID) return false; // Match bits straddle EOF
            int matchlen = std::bit_width(match) - 1;
            if (prevopcode != Instruction::MATCH) had_incomplete_match = false;
            if (matchlen < 8 && had_incomplete_match) return false; // Within a sequence of matches only at most one should be incomplete
            had_incomplete_match = (matchlen < 8);
            if (bits < matchlen) return false; // Consuming bits past the end of the input
            bits -= matchlen;
            prevopcode = Instruction::MATCH;
        } else if (opcode == Instruction::DEFAULT) {
            if (prevopcode == Instruction::DEFAULT) return false; // There should not be two successive DEFAULTs (they could be combined into one)
            uint32_t asn = DecodeASN(pos, endpos);
            if (asn == INVALID) return false; // ASN straddles EOF
            prevopcode = Instruction::DEFAULT;
        } else {
            return false; // Instruction straddles EOF
        }
    }
    return false; // Reached EOF without RETURN instruction
}